

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall picojson::default_parse_context::set_null(default_parse_context *this)

{
  value local_18;
  
  local_18.type_ = 0;
  picojson::value::operator=(this->out_,&local_18);
  picojson::value::~value(&local_18);
  return true;
}

Assistant:

bool set_null() {
      *out_ = value();
      return true;
    }